

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTextInterface::textBeforeOffset
          (QString *__return_storage_ptr__,QAccessibleTextInterface *this,int offset,
          TextBoundaryType boundaryType,int *startOffset,int *endOffset)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QTextBoundaryFinder boundary;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  uVar1 = (*this->_vptr_QAccessibleTextInterface[0xd])(this);
  (*this->_vptr_QAccessibleTextInterface[9])(&local_58,this,0,(ulong)uVar1);
  uVar1 = (uint)local_58.size;
  if (offset != -1) {
    uVar1 = offset;
  }
  *endOffset = -1;
  *startOffset = -1;
  if ((0 < (int)uVar1 && (undefined1 *)local_58.size != (undefined1 *)0x0) &&
     ((undefined1 *)(ulong)uVar1 <= (ulong)local_58.size)) {
    if (boundaryType < ParagraphBoundary) {
      boundary.attributes = (QCharAttributes *)&DAT_aaaaaaaaaaaaaaaa;
      boundary.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      boundary._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
      boundary.sv.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      boundary.sv.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      boundary.s.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      boundary.s.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      boundary._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      boundary.s.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QTextBoundaryFinder::QTextBoundaryFinder(&boundary,boundaryType,(QString *)&local_58);
      QTextBoundaryFinder::setPosition((longlong)&boundary);
      do {
        uVar3 = QTextBoundaryFinder::boundaryReasons();
        if ((uVar3 & 0x60) != 0) break;
        lVar4 = QTextBoundaryFinder::toPreviousBoundary();
      } while (0 < lVar4);
      iVar2 = QTextBoundaryFinder::position();
      *endOffset = iVar2;
      do {
        lVar4 = QTextBoundaryFinder::toPreviousBoundary();
        if (lVar4 < 1) break;
        uVar3 = QTextBoundaryFinder::boundaryReasons();
      } while ((uVar3 & 0x60) == 0);
      iVar2 = QTextBoundaryFinder::position();
      *startOffset = iVar2;
      QString::mid((longlong)__return_storage_ptr__,(longlong)&local_58);
      QTextBoundaryFinder::~QTextBoundaryFinder(&boundary);
      goto LAB_004f5e3e;
    }
    if (boundaryType - ParagraphBoundary < 2) {
      textLineBoundary(__return_storage_ptr__,-1,(QString *)&local_58,uVar1,startOffset,endOffset);
      goto LAB_004f5e3e;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_004f5e3e:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleTextInterface::textBeforeOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                                   int *startOffset, int *endOffset) const
{
    const QString txt = text(0, characterCount());

    if (offset == -1)
        offset = txt.size();

    *startOffset = *endOffset = -1;
    if (txt.isEmpty() || offset <= 0 || offset > txt.size())
        return QString();

    // type initialized just to silence a compiler warning [-Werror=maybe-uninitialized]
    QTextBoundaryFinder::BoundaryType type = QTextBoundaryFinder::Grapheme;
    switch (boundaryType) {
    case QAccessible::CharBoundary:
        type = QTextBoundaryFinder::Grapheme;
        break;
    case QAccessible::WordBoundary:
        type = QTextBoundaryFinder::Word;
        break;
    case QAccessible::SentenceBoundary:
        type = QTextBoundaryFinder::Sentence;
        break;
    case QAccessible::LineBoundary:
    case QAccessible::ParagraphBoundary:
        // Lines can not use QTextBoundaryFinder since Line there means any potential line-break.
        return textLineBoundary(-1, txt, offset, startOffset, endOffset);
    case QAccessible::NoBoundary:
        // return empty, this function currently only supports single lines, so there can be no line before
        return QString();
    default:
        Q_UNREACHABLE();
    }

    // keep behavior in sync with QTextCursor::movePosition()!

    QTextBoundaryFinder boundary(type, txt);
    boundary.setPosition(offset);

    do {
        if ((boundary.boundaryReasons() & (QTextBoundaryFinder::StartOfItem | QTextBoundaryFinder::EndOfItem)))
            break;
    } while (boundary.toPreviousBoundary() > 0);
    Q_ASSERT(boundary.position() >= 0);
    *endOffset = boundary.position();

    while (boundary.toPreviousBoundary() > 0) {
        if ((boundary.boundaryReasons() & (QTextBoundaryFinder::StartOfItem | QTextBoundaryFinder::EndOfItem)))
            break;
    }
    Q_ASSERT(boundary.position() >= 0);
    *startOffset = boundary.position();

    return txt.mid(*startOffset, *endOffset - *startOffset);
}